

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexSubImage2DDepthCase::createTexture(TexSubImage2DDepthCase *this)

{
  ContextWrapper *this_00;
  int internalFormat;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  TransferFormat TVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  deUint32 tex;
  ContextWrapper *local_c8;
  ulong local_c0;
  TransferFormat local_b8;
  Vec4 gMax;
  Vec4 gMin;
  TextureLevel levelData;
  PixelBufferAccess local_68;
  Random rnd;
  
  TVar6 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  dVar1 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  tex = 0;
  local_c0 = (ulong)TVar6 >> 0x20;
  local_b8 = TVar6;
  local_68.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(TVar6.format,TVar6.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_68);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError(this_00);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                  ,0xc3d);
  local_c8 = this_00;
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    iVar8 = 0;
    do {
      iVar9 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar8 & 0x1f);
      if (iVar9 < 2) {
        iVar9 = 1;
      }
      iVar10 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar8 & 0x1f);
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      gMin.m_data[0] = -1.5;
      gMin.m_data[1] = -2.0;
      gMin.m_data[2] = 1.7;
      gMin.m_data[3] = -1.5;
      gMax.m_data[0] = 2.0;
      gMax.m_data[1] = 1.5;
      gMax.m_data[2] = -1.0;
      gMax.m_data[3] = 2.0;
      tcu::TextureLevel::setSize(&levelData,iVar9,iVar10,1);
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      tcu::fillWithComponentGradients(&local_68,&gMin,&gMax);
      internalFormat = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (local_c8,0xde1,iVar8,internalFormat,iVar9,iVar10,0,local_b8.format,
                 (deUint32)local_c0,local_68.super_ConstPixelBufferAccess.m_data);
      iVar8 = iVar8 + 1;
    } while (iVar8 < (this->super_Texture2DSpecCase).m_numLevels);
  }
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    iVar8 = 0;
    do {
      uVar11 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar8 & 0x1f);
      if ((int)uVar11 < 2) {
        uVar11 = 1;
      }
      uVar7 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar8 & 0x1f);
      if ((int)uVar7 < 2) {
        uVar7 = 1;
      }
      dVar1 = deRandom_getUint32(&rnd.m_rnd);
      dVar2 = deRandom_getUint32(&rnd.m_rnd);
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      gMin.m_data[0] = 2.0;
      gMin.m_data[1] = 1.5;
      gMin.m_data[2] = -1.0;
      gMin.m_data[3] = 2.0;
      gMax.m_data[0] = -1.5;
      gMax.m_data[1] = -2.0;
      gMax.m_data[2] = 1.7;
      gMax.m_data[3] = -1.5;
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      iVar9 = dVar1 % uVar11 + 1;
      iVar10 = dVar2 % uVar7 + 1;
      tcu::TextureLevel::setSize(&levelData,iVar9,iVar10,1);
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      tcu::fillWithGrid(&local_68,dVar5 % 0xf + 2,&gMin,&gMax);
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      sglr::ContextWrapper::glTexSubImage2D
                (local_c8,0xde1,iVar8,dVar3 % (uVar11 - dVar1 % uVar11),
                 dVar4 % (uVar7 - dVar2 % uVar7),iVar9,iVar10,local_b8.format,(deUint32)local_c0,
                 local_68.super_ConstPixelBufferAccess.m_data);
      iVar8 = iVar8 + 1;
    } while (iVar8 < (this->super_Texture2DSpecCase).m_numLevels);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_width >> ndx);
			const int   levelH		= de::max(1, m_height >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_width >> ndx);
			const int	levelH		= de::max(1, m_height >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelH);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelH-h);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, x, y, w, h, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}